

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O1

void __thiscall BamTools::BamAlignment::RemoveTag(BamAlignment *this,string *tag)

{
  uint uVar1;
  ulong uVar2;
  pointer __src;
  uint uVar3;
  pointer pcVar4;
  bool bVar5;
  void *pvVar6;
  uint numBytesParsed;
  char *pTagData;
  uint originalTagDataLength;
  uint local_4c;
  void *local_48;
  pointer local_40;
  uint local_34;
  
  if ((this->SupportData).HasCoreOnly == true) {
    BuildCharData(this);
  }
  uVar2 = (this->TagData)._M_string_length;
  if (uVar2 != 0) {
    __src = (this->TagData)._M_dataplus._M_p;
    local_4c = 0;
    local_40 = __src;
    local_34 = (uint)uVar2;
    bVar5 = FindTag(this,tag,&local_40,&local_34,&local_4c);
    if (bVar5) {
      pvVar6 = operator_new__(uVar2 & 0xffffffff);
      memset(pvVar6,0,uVar2 & 0xffffffff);
      pcVar4 = local_40;
      uVar3 = local_4c;
      local_40 = local_40 + -3;
      uVar1 = local_4c - 3;
      local_4c = uVar1;
      local_48 = pvVar6;
      memcpy(pvVar6,__src,(ulong)uVar1);
      local_4c = uVar3;
      local_40 = pcVar4;
      bVar5 = SkipToNextTag(this,pcVar4[-1],&local_40,&local_4c);
      pvVar6 = local_48;
      if (bVar5) {
        memcpy((void *)((long)local_48 + (ulong)uVar1),local_40,
               (ulong)(((uint)uVar2 - uVar3) + (uVar1 - local_4c) + 3));
        std::__cxx11::string::_M_replace
                  ((ulong)&this->TagData,0,(char *)(this->TagData)._M_string_length,(ulong)pvVar6);
      }
      operator_delete__(local_48);
    }
  }
  return;
}

Assistant:

void BamAlignment::RemoveTag(const std::string& tag) {
  
    // if char data not populated, do that first
    if ( SupportData.HasCoreOnly )
        BuildCharData();

    // skip if no tags available
    if ( TagData.empty() )
        return;
  
    // localize the tag data
    char* pOriginalTagData = (char*)TagData.data();
    char* pTagData = pOriginalTagData;
    const unsigned int originalTagDataLength = TagData.size();
    unsigned int newTagDataLength = 0;
    unsigned int numBytesParsed = 0;

    // skip if tag not found
    if  ( !FindTag(tag, pTagData, originalTagDataLength, numBytesParsed) )
        return;

    // otherwise, remove it
    RaiiBuffer newTagData(originalTagDataLength);

    // copy original tag data up til desired tag
    pTagData       -= 3;
    numBytesParsed -= 3;
    const unsigned int beginningTagDataLength = numBytesParsed;
    newTagDataLength += beginningTagDataLength;
    memcpy(newTagData.Buffer, pOriginalTagData, numBytesParsed);

    // attemp to skip to next tag
    const char* pTagStorageType = pTagData + 2;
    pTagData       += 3;
    numBytesParsed += 3;
    if ( SkipToNextTag(*pTagStorageType, pTagData, numBytesParsed) ) {

        // squeeze remaining tag data
        const unsigned int skippedDataLength = (numBytesParsed - beginningTagDataLength);
        const unsigned int endTagDataLength = originalTagDataLength - beginningTagDataLength - skippedDataLength;
        memcpy(newTagData.Buffer + beginningTagDataLength, pTagData, endTagDataLength );

        // save modified tag data in alignment
        TagData.assign(newTagData.Buffer, beginningTagDataLength + endTagDataLength);
    }
}